

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

bool Json::Reader::containsNewLine(Location begin,Location end)

{
  bool bVar1;
  
  bVar1 = begin < end;
  if (bVar1) {
    do {
      if (*begin == '\n') {
        return bVar1;
      }
      if (*begin == '\r') {
        return bVar1;
      }
      begin = begin + 1;
      bVar1 = begin < end;
    } while (begin != end);
  }
  return bVar1;
}

Assistant:

bool Reader::containsNewLine(Reader::Location begin, Reader::Location end) {
  for (; begin < end; ++begin)
    if (*begin == '\n' || *begin == '\r')
      return true;
  return false;
}